

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunction_Repeat.cpp
# Opt level: O1

void __thiscall
chrono::ChFunction_Repeat::ArchiveOUT(ChFunction_Repeat *this,ChArchiveOut *marchive)

{
  ChNameValue<std::shared_ptr<chrono::ChFunction>_> local_38;
  
  ChArchiveOut::VersionWrite<chrono::ChFunction_Repeat>(marchive);
  ChFunction::ArchiveOUT(&this->super_ChFunction,marchive);
  local_38._value = &this->fa;
  local_38._name = "fa";
  local_38._flags = '\0';
  ChArchiveOut::out<chrono::ChFunction>(marchive,&local_38);
  local_38._value = (shared_ptr<chrono::ChFunction> *)&this->window_start;
  local_38._name = "window_start";
  local_38._flags = '\0';
  (*(marchive->super_ChArchive)._vptr_ChArchive[4])(marchive,&local_38);
  local_38._value = (shared_ptr<chrono::ChFunction> *)&this->window_length;
  local_38._name = "window_length";
  local_38._flags = '\0';
  (*(marchive->super_ChArchive)._vptr_ChArchive[4])(marchive,&local_38);
  local_38._value = (shared_ptr<chrono::ChFunction> *)&this->window_phase;
  local_38._name = "window_phase";
  local_38._flags = '\0';
  (*(marchive->super_ChArchive)._vptr_ChArchive[4])(marchive,&local_38);
  return;
}

Assistant:

void ChFunction_Repeat::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChFunction_Repeat>();
    // serialize parent class
    ChFunction::ArchiveOUT(marchive);
    // serialize all member data:
    marchive << CHNVP(fa);
    marchive << CHNVP(window_start);
    marchive << CHNVP(window_length);
    marchive << CHNVP(window_phase);
}